

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::InnerMap::iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_unsigned_long>
* __thiscall
google::protobuf::Map<std::__cxx11::string,std::__cxx11::string>::InnerMap::
FindHelper<std::__cxx11::string>
          (pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::InnerMap::iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_unsigned_long>
           *__return_storage_ptr__,void *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k,TreeIterator *it)

{
  long lVar1;
  _Rb_tree<std::reference_wrapper<std::__cxx11::string_const>,std::pair<std::reference_wrapper<std::__cxx11::string_const>const,void*>,std::_Select1st<std::pair<std::reference_wrapper<std::__cxx11::string_const>const,void*>>,google::protobuf::internal::TransparentSupport<std::__cxx11::string>::less,google::protobuf::internal::MapAllocator<std::pair<std::reference_wrapper<std::__cxx11::string_const>const,void*>>>
  *this_00;
  bool bVar2;
  size_t sVar3;
  const_iterator tree_it;
  _Rb_tree<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_*>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_*>_>,_google::protobuf::internal::TransparentSupport<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::less,_google::protobuf::internal::MapAllocator<std::pair<const_std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_*>_>_>
  *__const_this;
  Node *t;
  uint uVar4;
  unsigned_long index;
  
  sVar3 = internal::TransparentSupport<std::__cxx11::string>::hash::operator()((hash *)this,k);
  uVar4 = (uint)((sVar3 ^ *(ulong *)((long)this + 0x10)) * -0x61c8864680b583eb >> 0x20) &
          *(int *)((long)this + 8) - 1U;
  index = (unsigned_long)uVar4;
  lVar1 = *(long *)((long)this + 0x20);
  t = *(Node **)(lVar1 + index * 8);
  if (t != (Node *)0x0) {
    if (t == *(Node **)(lVar1 + (index ^ 1) * 8)) {
      index = (unsigned_long)(uVar4 & 0xfffffffe);
      this_00 = *(_Rb_tree<std::reference_wrapper<std::__cxx11::string_const>,std::pair<std::reference_wrapper<std::__cxx11::string_const>const,void*>,std::_Select1st<std::pair<std::reference_wrapper<std::__cxx11::string_const>const,void*>>,google::protobuf::internal::TransparentSupport<std::__cxx11::string>::less,google::protobuf::internal::MapAllocator<std::pair<std::reference_wrapper<std::__cxx11::string_const>const,void*>>>
                  **)(lVar1 + index * 8);
      tree_it = std::
                _Rb_tree<std::reference_wrapper<std::__cxx11::string_const>,std::pair<std::reference_wrapper<std::__cxx11::string_const>const,void*>,std::_Select1st<std::pair<std::reference_wrapper<std::__cxx11::string_const>const,void*>>,google::protobuf::internal::TransparentSupport<std::__cxx11::string>::less,google::protobuf::internal::MapAllocator<std::pair<std::reference_wrapper<std::__cxx11::string_const>const,void*>>>
                ::_M_find_tr<std::__cxx11::string,void>(this_00,k);
      if (tree_it._M_node != (_Base_ptr)(this_00 + 0x10)) {
        if (it != (TreeIterator *)0x0) {
          it->_M_node = tree_it._M_node;
        }
        Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::InnerMap::
        iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::iterator_base(&__return_storage_ptr__->first,(TreeIterator)tree_it._M_node,
                        (InnerMap *)this,index);
        goto LAB_0022f396;
      }
    }
    else {
      do {
        bVar2 = internal::TransparentSupport<std::__cxx11::string>::
                Equals<std::__cxx11::string,std::__cxx11::string>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)t,k)
        ;
        if (bVar2) {
          (__return_storage_ptr__->first).node_ = t;
          (__return_storage_ptr__->first).m_ = (InnerMap *)this;
          (__return_storage_ptr__->first).bucket_index_ = index;
          goto LAB_0022f396;
        }
        t = t->next;
      } while (t != (Node *)0x0);
    }
  }
  (__return_storage_ptr__->first).node_ = (Node *)0x0;
  (__return_storage_ptr__->first).m_ = (InnerMap *)0x0;
  (__return_storage_ptr__->first).bucket_index_ = 0;
LAB_0022f396:
  __return_storage_ptr__->second = index;
  return __return_storage_ptr__;
}

Assistant:

std::pair<const_iterator, size_type> FindHelper(const K& k,
                                                    TreeIterator* it) const {
      size_type b = BucketNumber(k);
      if (TableEntryIsNonEmptyList(b)) {
        Node* node = static_cast<Node*>(table_[b]);
        do {
          if (internal::TransparentSupport<Key>::Equals(node->kv.first, k)) {
            return std::make_pair(const_iterator(node, this, b), b);
          } else {
            node = node->next;
          }
        } while (node != nullptr);
      } else if (TableEntryIsTree(b)) {
        GOOGLE_DCHECK_EQ(table_[b], table_[b ^ 1]);
        b &= ~static_cast<size_t>(1);
        Tree* tree = static_cast<Tree*>(table_[b]);
        auto tree_it = tree->find(k);
        if (tree_it != tree->end()) {
          if (it != nullptr) *it = tree_it;
          return std::make_pair(const_iterator(tree_it, this, b), b);
        }
      }
      return std::make_pair(end(), b);
    }